

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

VkStencilOpState * __thiscall
vkt::pipeline::anon_unknown_0::StencilOpStateUniqueRandomIterator::getIndexedValue
          (VkStencilOpState *__return_storage_ptr__,StencilOpStateUniqueRandomIterator *this,
          deUint32 index)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  deUint32 stencilFailOpIndex;
  deUint32 stencilPassOpSeqIndex;
  deUint32 stencilPassOpIndex;
  deUint32 stencilDepthFailOpSeqIndex;
  deUint32 stencilDepthFailOpIndex;
  deUint32 stencilCompareOpSeqIndex;
  deUint32 stencilCompareOpIndex;
  deUint32 index_local;
  StencilOpStateUniqueRandomIterator *this_local;
  
  uVar1 = index >> 9;
  uVar2 = index + uVar1 * -0x200 >> 6;
  uVar3 = index + uVar1 * -0x200 + uVar2 * -0x40 >> 3;
  __return_storage_ptr__->failOp =
       *(VkStencilOp *)
        (pipeline::(anonymous_namespace)::StencilOpStateUniqueRandomIterator::m_stencilOps +
        (ulong)(index + uVar1 * -0x200 + uVar2 * -0x40 + uVar3 * -8) * 4);
  __return_storage_ptr__->passOp =
       *(VkStencilOp *)
        (pipeline::(anonymous_namespace)::StencilOpStateUniqueRandomIterator::m_stencilOps +
        (ulong)uVar3 * 4);
  __return_storage_ptr__->depthFailOp =
       *(VkStencilOp *)
        (pipeline::(anonymous_namespace)::StencilOpStateUniqueRandomIterator::m_stencilOps +
        (ulong)uVar2 * 4);
  __return_storage_ptr__->compareOp =
       *(VkCompareOp *)
        (pipeline::(anonymous_namespace)::StencilOpStateUniqueRandomIterator::m_compareOps +
        (ulong)uVar1 * 4);
  __return_storage_ptr__->compareMask = 0;
  __return_storage_ptr__->writeMask = 0;
  __return_storage_ptr__->reference = 0;
  return __return_storage_ptr__;
}

Assistant:

VkStencilOpState StencilOpStateUniqueRandomIterator::getIndexedValue (deUint32 index)
{
	const deUint32 stencilCompareOpIndex = index / m_stencilOpsLength3;
	const deUint32 stencilCompareOpSeqIndex = stencilCompareOpIndex * m_stencilOpsLength3;

	const deUint32 stencilDepthFailOpIndex = (index - stencilCompareOpSeqIndex) / m_stencilOpsLength2;
	const deUint32 stencilDepthFailOpSeqIndex = stencilDepthFailOpIndex * m_stencilOpsLength2;

	const deUint32 stencilPassOpIndex = (index - stencilCompareOpSeqIndex - stencilDepthFailOpSeqIndex) / m_stencilOpsLength;
	const deUint32 stencilPassOpSeqIndex = stencilPassOpIndex * m_stencilOpsLength;

	const deUint32 stencilFailOpIndex = index - stencilCompareOpSeqIndex - stencilDepthFailOpSeqIndex - stencilPassOpSeqIndex;

	const VkStencilOpState stencilOpState =
	{
		m_stencilOps[stencilFailOpIndex],		// VkStencilOp	failOp;
		m_stencilOps[stencilPassOpIndex],		// VkStencilOp	passOp;
		m_stencilOps[stencilDepthFailOpIndex],	// VkStencilOp	depthFailOp;
		m_compareOps[stencilCompareOpIndex],	// VkCompareOp	compareOp;
		0x0,									// deUint32		compareMask;
		0x0,									// deUint32		writeMask;
		0x0										// deUint32		reference;
	};

	return stencilOpState;
}